

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

long jsteemann::atoi_positive<long>(char *p,char *e,int *errcode)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = -1;
  if (p == e) {
    lVar2 = 0;
    iVar3 = -1;
  }
  else {
    lVar2 = 0;
    do {
      bVar1 = *p;
      if (((ulong)bVar1 < 0x21) && ((0x100003e01U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
      if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_00316610;
      if ((0xccccccccccccccc < lVar2) || (lVar2 == 0xccccccccccccccc && 7 < (byte)(bVar1 - 0x30))) {
        iVar3 = -3;
        goto LAB_00316610;
      }
      lVar2 = (ulong)(byte)(bVar1 - 0x30) + lVar2 * 10;
      p = (char *)((byte *)p + 1);
    } while (p < e);
    iVar3 = 0;
  }
LAB_00316610:
  *errcode = iVar3;
  return lVar2;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, int& errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    if ((c == '\0') || (c == ' ') || (c == '\t') || (c == '\n') || (c == '\r') || (c == '\v') || (c == '\f')) {
      errcode = 0;
      return result;
    }

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      errcode = -1;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      errcode = -3;
      return result;
    }
    result *= 10;
    result += c;
  } while (++p < e);

  errcode = 0;
  return result;
}